

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

bool fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>
               (appender *out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
               locale_ref loc)

{
  char cVar1;
  long lVar2;
  char cVar3;
  uint size;
  appender aVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  size_type sVar8;
  _Alloc_hider _Var9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  thousands_sep_result<char> ts;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  thousands_sep_result<char> local_2b0;
  char local_288 [48];
  anon_class_16_2_3f014a30 local_258;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  ulong count;
  
  thousands_sep<char>(&local_2b0,loc);
  cVar3 = local_2b0.thousands_sep;
  if (local_2b0.thousands_sep != '\0') {
    size = count_digits(value);
    uVar12 = (ulong)size;
    iVar5 = (int)local_2b0.grouping._M_string_length + size;
    uVar11 = size;
    for (sVar8 = 0; local_2b0.grouping._M_string_length != sVar8; sVar8 = sVar8 + 1) {
      cVar1 = local_2b0.grouping._M_dataplus._M_p[sVar8];
      uVar10 = uVar11 - (int)cVar1;
      if ((uVar10 == 0 || (int)uVar11 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
        iVar5 = size + (int)sVar8;
        if (local_2b0.grouping._M_string_length != sVar8) goto LAB_00110c0d;
        break;
      }
      uVar11 = uVar10;
    }
    iVar5 = (int)(uVar11 - 1) /
            (int)local_2b0.grouping._M_dataplus._M_p[local_2b0.grouping._M_string_length - 1] +
            iVar5;
LAB_00110c0d:
    format_decimal<char,unsigned_long>(local_288,value,size);
    local_248.super_buffer<char>.ptr_ = local_248.store_;
    local_248.super_buffer<char>.size_ = 0;
    local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0015c4c0;
    local_248.super_buffer<char>.capacity_ = 500;
    uVar11 = (iVar5 + 1) - (uint)(prefix == 0);
    count = (ulong)uVar11;
    buffer<char>::try_resize(&local_248.super_buffer<char>,count);
    iVar5 = 0;
    pcVar7 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar11 + -1;
    _Var9._M_p = local_2b0.grouping._M_dataplus._M_p;
    while (pcVar6 = pcVar7, 1 < (int)uVar12) {
      lVar2 = uVar12 - 1;
      uVar12 = uVar12 - 1;
      *pcVar6 = local_288[lVar2];
      pcVar7 = pcVar6 + -1;
      cVar1 = *_Var9._M_p;
      if ('\0' < cVar1) {
        iVar5 = iVar5 + 1;
        if ((cVar1 != '\x7f') && (iVar5 % (int)cVar1 == 0)) {
          if (_Var9._M_p + 1 !=
              local_2b0.grouping._M_dataplus._M_p + local_2b0.grouping._M_string_length) {
            iVar5 = 0;
            _Var9._M_p = _Var9._M_p + 1;
          }
          *pcVar7 = local_2b0.thousands_sep;
          pcVar7 = pcVar6 + -2;
        }
      }
    }
    *pcVar6 = local_288[0];
    if (prefix != 0) {
      pcVar6[-1] = (char)prefix;
    }
    local_258.data = local_248.super_buffer<char>.ptr_;
    local_258.size = uVar11;
    aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>(fmt::v8::appender&,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>
                      ((appender)
                       (out->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container,
                       specs,count,count,&local_258);
    (out->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container =
         (buffer<char> *)aVar4;
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_248);
  }
  std::__cxx11::string::~string((string *)&local_2b0);
  return cVar3 != '\0';
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  const auto sep_size = 1;
  auto ts = thousands_sep<Char>(loc);
  if (!ts.thousands_sep) return false;
  int num_digits = count_digits(value);
  int size = num_digits, n = num_digits;
  const std::string& groups = ts.grouping;
  std::string::const_iterator group = groups.cbegin();
  while (group != groups.cend() && n > *group && *group > 0 &&
         *group != max_value<char>()) {
    size += sep_size;
    n -= *group;
    ++group;
  }
  if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
  char digits[40];
  format_decimal(digits, value, num_digits);
  basic_memory_buffer<Char> buffer;
  if (prefix != 0) ++size;
  const auto usize = to_unsigned(size);
  buffer.resize(usize);
  basic_string_view<Char> s(&ts.thousands_sep, sep_size);
  // Index of a decimal digit with the least significant digit having index 0.
  int digit_index = 0;
  group = groups.cbegin();
  auto p = buffer.data() + size - 1;
  for (int i = num_digits - 1; i > 0; --i) {
    *p-- = static_cast<Char>(digits[i]);
    if (*group <= 0 || ++digit_index % *group != 0 ||
        *group == max_value<char>())
      continue;
    if (group + 1 != groups.cend()) {
      digit_index = 0;
      ++group;
    }
    std::uninitialized_copy(s.data(), s.data() + s.size(),
                            make_checked(p, s.size()));
    p -= s.size();
  }
  *p-- = static_cast<Char>(*digits);
  if (prefix != 0) *p = static_cast<Char>(prefix);
  auto data = buffer.data();
  out = write_padded<align::right>(
      out, specs, usize, usize, [=](reserve_iterator<OutputIt> it) {
        return copy_str<Char>(data, data + size, it);
      });
  return true;
}